

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

CScript * GetScriptForMultisig(int nRequired,vector<CPubKey,_std::allocator<CPubKey>_> *keys)

{
  long lVar1;
  span<const_unsigned_char,_18446744073709551615UL> b;
  bool bVar2;
  undefined8 in_RDX;
  CScript *in_RDI;
  long in_FS_OFFSET;
  CPubKey *key;
  vector<CPubKey,_std::allocator<CPubKey>_> *__range1;
  CScript *script;
  const_iterator __end1;
  const_iterator __begin1;
  CScript *in_stack_ffffffffffffff58;
  vector<CPubKey,_std::allocator<CPubKey>_> *in_stack_ffffffffffffff60;
  span<const_unsigned_char,_18446744073709551615UL> *in_stack_ffffffffffffff68;
  CScript *this;
  opcodetype opcode;
  CScript *in_stack_ffffffffffffff90;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  CScript::CScript(in_stack_ffffffffffffff58);
  CScript::operator<<((CScript *)in_stack_ffffffffffffff68,(int64_t)in_stack_ffffffffffffff60);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::begin(in_stack_ffffffffffffff60);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::end(in_stack_ffffffffffffff60);
  while( true ) {
    bVar2 = __gnu_cxx::operator==<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>
                      ((__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>
                        *)in_stack_ffffffffffffff68,
                       (__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>
                        *)in_stack_ffffffffffffff60);
    opcode = (opcodetype)((ulong)in_RDX >> 0x20);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>::
    operator*((__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_> *
              )in_stack_ffffffffffffff58);
    ToByteVector<CPubKey>((CPubKey *)in_stack_ffffffffffffff98._M_extent_value);
    std::span<const_unsigned_char,_18446744073709551615UL>::
    span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              (in_stack_ffffffffffffff68,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff60);
    b._M_extent._M_extent_value = in_stack_ffffffffffffff98._M_extent_value;
    b._M_ptr = (pointer)in_stack_ffffffffffffff90;
    CScript::operator<<(this,b);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff68);
    __gnu_cxx::__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>::
    operator++((__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>
                *)in_stack_ffffffffffffff58);
  }
  std::vector<CPubKey,_std::allocator<CPubKey>_>::size
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_ffffffffffffff58);
  CScript::operator<<((CScript *)in_stack_ffffffffffffff68,(int64_t)in_stack_ffffffffffffff60);
  CScript::operator<<(in_stack_ffffffffffffff90,opcode);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

CScript GetScriptForMultisig(int nRequired, const std::vector<CPubKey>& keys)
{
    CScript script;

    script << nRequired;
    for (const CPubKey& key : keys)
        script << ToByteVector(key);
    script << keys.size() << OP_CHECKMULTISIG;

    return script;
}